

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O0

string * __thiscall DataRefs::CSLPathCfgTy::operator=(CSLPathCfgTy *this,string *_p)

{
  long in_RDI;
  CSLPathCfgTy *in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffe8;
  
  LTRemoveXPSystemPath(in_stack_ffffffffffffffe8);
  std::__cxx11::string::operator=((string *)(in_RDI + 8),(string *)&stack0xffffffffffffffd0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  existsSave(in_stack_ffffffffffffffd0);
  return (string *)(in_RDI + 8);
}

Assistant:

const std::string& DataRefs::CSLPathCfgTy::operator= (const std::string& _p)
{
    path = LTRemoveXPSystemPath(_p);        // store (shortened) path
    existsSave();                           // check for existence
    return path;
}